

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VCFrontEnd.h
# Opt level: O2

string * __thiscall
VCTools::InputParser::getCmdOption(string *__return_storage_ptr__,InputParser *this,string *option)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  int iVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  string *psVar4;
  allocator local_11;
  
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((this->tokens).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->tokens).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  pbVar1 = (this->tokens).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((_Var3._M_current == pbVar1) || (psVar4 = _Var3._M_current + 1, psVar4 == pbVar1)) {
    if ((getCmdOption(std::__cxx11::string_const&)::empty_string_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&getCmdOption(std::__cxx11::string_const&)::
                                     empty_string_abi_cxx11_), iVar2 != 0)) {
      std::__cxx11::string::string
                ((string *)&getCmdOption(std::__cxx11::string_const&)::empty_string_abi_cxx11_,"",
                 &local_11);
      __cxa_atexit(std::__cxx11::string::~string,
                   &getCmdOption(std::__cxx11::string_const&)::empty_string_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&getCmdOption(std::__cxx11::string_const&)::empty_string_abi_cxx11_);
    }
    psVar4 = &getCmdOption(std::__cxx11::string_const&)::empty_string_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
  return __return_storage_ptr__;
}

Assistant:

string getCmdOption(const string & option) const {
			vector<string>::const_iterator itr;
			itr = find(this->tokens.begin(), this->tokens.end(), option);
			if (itr != this->tokens.end() && ++itr != this->tokens.end()) {
				return *itr;
			}
			static const string empty_string("");
			return empty_string;
		}